

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O2

bool __thiscall
Js::SerializationCloner<Js::StreamWriter>::TryClonePrimitive
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId typeId,Src src,Dst *dst)

{
  StreamWriter *pSVar1;
  int32 iVar2;
  JavascriptBoolean *pJVar3;
  JavascriptTypedNumber<long> *pJVar4;
  JavascriptTypedNumber<unsigned_long> *pJVar5;
  uint32 data;
  double local_20;
  
  switch(typeId) {
  case TypeIds_Undefined:
    data = 3;
    goto LAB_00d601a6;
  case TypeIds_Null:
    data = 2;
    goto LAB_00d601a6;
  case TypeIds_Boolean:
    pJVar3 = VarTo<Js::JavascriptBoolean>(src);
    data = (pJVar3->value == 0) + 4;
LAB_00d601a6:
    Write(this,data);
    break;
  case TypeIds_FirstNumberType:
    Write(this,6);
    pSVar1 = this->m_writer;
    iVar2 = TaggedInt::ToInt32(src);
    local_20 = (double)CONCAT44(local_20._4_4_,iVar2);
    StreamWriter::Write<int>(pSVar1,(int *)&local_20);
    break;
  case TypeIds_Number:
    Write(this,7);
    pSVar1 = this->m_writer;
    local_20 = JavascriptNumber::GetValue(src);
    StreamWriter::Write<double>(pSVar1,&local_20);
    break;
  case TypeIds_Int64Number:
    Write(this,9);
    pSVar1 = this->m_writer;
    pJVar4 = VarTo<Js::JavascriptTypedNumber<long>>(src);
    local_20 = (double)pJVar4->m_value;
    StreamWriter::Write<long>(pSVar1,(long *)&local_20);
    break;
  case TypeIds_LastNumberType:
    Write(this,10);
    pSVar1 = this->m_writer;
    pJVar5 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(src);
    local_20 = (double)pJVar5->m_value;
    StreamWriter::Write<unsigned_long>(pSVar1,(unsigned_long *)&local_20);
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool SerializationCloner<Writer>::TryClonePrimitive(SrcTypeId typeId, Src src, Dst* dst)
    {
        switch (typeId)
        {
        case TypeIds_Undefined:
            WriteTypeId(SCA_UndefinedValue);
            break;

        case TypeIds_Null:
            WriteTypeId(SCA_NullValue);
            break;

        case TypeIds_Boolean:
            WriteTypeId(
                VarTo<JavascriptBoolean>(src)->GetValue() ? SCA_TrueValue : SCA_FalseValue);
            break;

        case TypeIds_Integer:
            {
                WriteTypeId(SCA_Int32Value);
                m_writer->Write(TaggedInt::ToInt32(src));
            }
            break;

        case TypeIds_Number:
            {
                WriteTypeId(SCA_DoubleValue);
                m_writer->Write(JavascriptNumber::GetValue(src));
            }
            break;

        case TypeIds_Int64Number:
            {
                WriteTypeId(SCA_Int64Value);
                m_writer->Write(VarTo<JavascriptInt64Number>(src)->GetValue());
            }
            break;

        case TypeIds_UInt64Number:
            {
                WriteTypeId(SCA_Uint64Value);
                m_writer->Write(VarTo<JavascriptUInt64Number>(src)->GetValue());
            }
            break;

        default:
            return false; // Not a recognized primitive type
        }

        return true;
    }